

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall
TestParser_TestDeclareStmt_Test::~TestParser_TestDeclareStmt_Test
          (TestParser_TestDeclareStmt_Test *this)

{
  TestParser_TestDeclareStmt_Test *this_local;
  
  ~TestParser_TestDeclareStmt_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestParser, TestDeclareStmt){
    cout << R"(
            ---- test_declarestmt ----
            )" << endl;
    string buff = R"(
                    declare x
                    declare x, y
                    declare x, y, z
                   )";
    Lexer* l = Lexer::New(buff);
    Parser* parser = Parser::New(l);
    auto program = parser->parseProgram();
    EXPECT_TRUE(!program->Stmts.empty());
    EXPECT_EQ((int)program->Stmts.size(), 3);
    cout << program << endl;
}